

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-shell.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  WASTScript *pWVar1;
  char **this;
  ostream *poVar2;
  WASTScript *script_00;
  string_view buffer;
  Options local_2e8 [8];
  Options options;
  Shell local_238;
  undefined1 local_160 [8];
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> skipped;
  undefined1 local_108 [8];
  Lexer lexer;
  string infile;
  Result<wasm::Ok> result;
  Result<std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>_>
  script;
  char local_48;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input;
  
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&skipped;
  skipped._M_t._M_impl._0_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  this = &lexer.buffer._M_str;
  skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       skipped._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,"-",(allocator<char> *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"wasm-shell",
             (allocator<char> *)
             ((long)&result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"Execute .wast files",
             (allocator<char> *)(infile.field_2._M_local_buf + 8));
  wasm::Options::Options(local_2e8,(string *)&local_238,(string *)local_108);
  std::__cxx11::string::~string((string *)local_108);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"INFILE",
             (allocator<char> *)
             ((long)&result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  lexer.pos = 0;
  lexer.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp:519:5)>
                ::_M_invoke;
  lexer.annotations.
  super__Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pointer)std::
                _Function_handler<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-shell.cpp:519:5)>
                ::_M_manager;
  local_108 = (undefined1  [8])this;
  wasm::Options::add_positional((string *)local_2e8,(Arguments)&local_238,(function *)0x1);
  std::_Function_base::~_Function_base((_Function_base *)local_108);
  std::__cxx11::string::~string((string *)&local_238);
  wasm::Options::parse((int)local_2e8,(char **)(ulong)(uint)argc);
  wasm::read_file<std::__cxx11::string>((string *)&local_40,(int)&lexer + 0x50);
  pWVar1 = (WASTScript *)
           ((long)&result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  wasm::WATParser::parseScript(pWVar1,input._M_dataplus._M_p,local_40);
  if (local_48 == '\x01') {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             (string *)
                             ((long)&result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    std::operator<<(poVar2,'\n');
  }
  else {
    buffer._M_str = local_40;
    buffer._M_len = (size_t)input._M_dataplus._M_p;
    wasm::WATParser::Lexer::Lexer
              ((Lexer *)local_108,buffer,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&skipped._M_t._M_impl.super__Rb_tree_header._M_node_count);
    Shell::Shell(&local_238,local_2e8);
    script_00 = (WASTScript *)0x0;
    if (local_48 == '\0') {
      script_00 = pWVar1;
    }
    Shell::run((Result<wasm::Ok> *)((long)&infile.field_2 + 8),&local_238,script_00);
    Shell::~Shell(&local_238);
    if (result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._M_u._24_1_ != '\x01') {
      Colors::green((ostream *)&std::cerr);
      Colors::bold((ostream *)&std::cerr);
      std::operator<<((ostream *)&std::cerr,"all checks passed.\n");
      Colors::normal((ostream *)&std::cerr);
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)((long)&infile.field_2 + 8));
      wasm::WATParser::Lexer::~Lexer((Lexer *)local_108);
      std::__detail::__variant::
      _Variant_storage<false,_std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>,_wasm::Err>
      ::~_Variant_storage((_Variant_storage<false,_std::vector<wasm::WATParser::ScriptEntry,_std::allocator<wasm::WATParser::ScriptEntry>_>,_wasm::Err>
                           *)((long)&result.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      std::__cxx11::string::~string((string *)&local_40);
      wasm::Options::~Options(local_2e8);
      std::__cxx11::string::~string((string *)&lexer.buffer._M_str);
      std::
      _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)local_160);
      return 0;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)(infile.field_2._M_local_buf + 8));
    std::operator<<(poVar2,'\n');
  }
  exit(1);
}

Assistant:

int main(int argc, const char* argv[]) {
  Name entry;
  std::set<size_t> skipped;

  // Read stdin by default.
  std::string infile = "-";
  Options options("wasm-shell", "Execute .wast files");
  options.add_positional(
    "INFILE",
    Options::Arguments::One,
    [&](Options* o, const std::string& argument) { infile = argument; });
  options.parse(argc, argv);

  auto input = read_file<std::string>(infile, Flags::Text);

  // Check that we can parse the script correctly with the new parser.
  auto script = WATParser::parseScript(input);
  if (auto* err = script.getErr()) {
    std::cerr << err->msg << '\n';
    exit(1);
  }

  Lexer lexer(input);
  auto result = Shell(options).run(*script);
  if (auto* err = result.getErr()) {
    std::cerr << err->msg << '\n';
    exit(1);
  }

  Colors::green(std::cerr);
  Colors::bold(std::cerr);
  std::cerr << "all checks passed.\n";
  Colors::normal(std::cerr);
}